

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_whitelist_signature_serialize
              (secp256k1_context *ctx,uchar *output,size_t *output_len,
              secp256k1_whitelist_signature *sig)

{
  secp256k1_whitelist_signature *sig_local;
  size_t *output_len_local;
  uchar *output_local;
  secp256k1_context *ctx_local;
  
  if (output == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"output != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (output_len == (size_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"output_len != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (sig == (secp256k1_whitelist_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (*output_len < (sig->n_keys + 1) * 0x20 + 1) {
    ctx_local._4_4_ = 0;
  }
  else {
    *output = (uchar)sig->n_keys;
    memcpy(output + 1,sig->data,(sig->n_keys + 1) * 0x20);
    *output_len = (sig->n_keys + 1) * 0x20 + 1;
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_whitelist_signature_serialize(const secp256k1_context* ctx, unsigned char *output, size_t *output_len, const secp256k1_whitelist_signature *sig) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(output_len != NULL);
    ARG_CHECK(sig != NULL);

    if (*output_len < 1 + 32 * (sig->n_keys + 1)) {
        return 0;
    }

    output[0] = sig->n_keys;
    memcpy(&output[1], &sig->data[0], 32 * (sig->n_keys + 1));
    *output_len = 1 + 32 * (sig->n_keys + 1);

    return 1;
}